

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O0

void project_monster_hurt_only
               (project_monster_handler_context_t *context,wchar_t flag,mon_messages hurt_msg,
               mon_messages die_msg)

{
  _Bool _Var1;
  mon_messages die_msg_local;
  mon_messages hurt_msg_local;
  wchar_t flag_local;
  project_monster_handler_context_t *context_local;
  
  if ((context->seen & 1U) != 0) {
    flag_on_dbg(context->lore->flags,0xc,flag,"context->lore->flags","flag");
  }
  _Var1 = flag_has_dbg(context->mon->race->flags,0xc,flag,"context->mon->race->flags","flag");
  if (_Var1) {
    context->hurt_msg = hurt_msg;
    context->die_msg = die_msg;
  }
  else {
    context->dam = L'\0';
  }
  return;
}

Assistant:

static void project_monster_hurt_only(project_monster_handler_context_t *context, int flag, enum mon_messages hurt_msg, enum mon_messages die_msg)
{
	if (context->seen) rf_on(context->lore->flags, flag);

	if (rf_has(context->mon->race->flags, flag)) {
		context->hurt_msg = hurt_msg;
		context->die_msg = die_msg;
	}
	else {
		context->dam = 0;
	}
}